

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O0

void Gia_ManTransferPacking(Gia_Man_t *p,Gia_Man_t *pGia)

{
  int Entry_00;
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pObj_01;
  int local_44;
  int nEntries2;
  int nEntries;
  int Entry;
  int k;
  int i;
  Gia_Obj_t *pObjNew;
  Gia_Obj_t *pObj;
  Vec_Int_t *vPackingNew;
  Gia_Man_t *pGia_local;
  Gia_Man_t *p_local;
  
  if (pGia->vPacking != (Vec_Int_t *)0x0) {
    Entry_00 = Vec_IntEntry(pGia->vPacking,0);
    local_44 = 0;
    iVar1 = Vec_IntSize(pGia->vPacking);
    p_00 = Vec_IntAlloc(iVar1);
    Vec_IntPush(p_00,Entry_00);
    Entry = 1;
    while (iVar1 = Vec_IntSize(pGia->vPacking), Entry < iVar1) {
      iVar1 = Vec_IntEntry(pGia->vPacking,Entry);
      if ((iVar1 < 1) || (3 < iVar1)) {
        __assert_fail("Entry > 0 && Entry < 4",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaIf.c"
                      ,0x7e5,"void Gia_ManTransferPacking(Gia_Man_t *, Gia_Man_t *)");
      }
      Vec_IntPush(p_00,iVar1);
      for (nEntries = 0; Entry = Entry + 1, nEntries < iVar1; nEntries = nEntries + 1) {
        iVar2 = Vec_IntEntry(pGia->vPacking,Entry);
        pObj_00 = Gia_ManObj(pGia,iVar2);
        iVar2 = Gia_ObjValue(pObj_00);
        iVar2 = Abc_Lit2Var(iVar2);
        pObj_01 = Gia_ManObj(p,iVar2);
        iVar2 = Gia_ObjId(pGia,pObj_00);
        iVar2 = Gia_ObjIsLut(pGia,iVar2);
        if (iVar2 == 0) {
          __assert_fail("Gia_ObjIsLut(pGia, Gia_ObjId(pGia, pObj))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaIf.c"
                        ,0x7ec,"void Gia_ManTransferPacking(Gia_Man_t *, Gia_Man_t *)");
        }
        iVar2 = Gia_ObjId(p,pObj_01);
        iVar2 = Gia_ObjIsLut(p,iVar2);
        if (iVar2 == 0) {
          __assert_fail("Gia_ObjIsLut(p, Gia_ObjId(p, pObjNew))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaIf.c"
                        ,0x7ed,"void Gia_ManTransferPacking(Gia_Man_t *, Gia_Man_t *)");
        }
        iVar2 = Gia_ObjId(p,pObj_01);
        Vec_IntPush(p_00,iVar2);
      }
      local_44 = local_44 + 1;
    }
    if (Entry_00 != local_44) {
      __assert_fail("nEntries == nEntries2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaIf.c"
                    ,0x7f4,"void Gia_ManTransferPacking(Gia_Man_t *, Gia_Man_t *)");
    }
    if (p->vPacking != (Vec_Int_t *)0x0) {
      __assert_fail("p->vPacking == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaIf.c"
                    ,0x7f6,"void Gia_ManTransferPacking(Gia_Man_t *, Gia_Man_t *)");
    }
    p->vPacking = p_00;
  }
  return;
}

Assistant:

void Gia_ManTransferPacking( Gia_Man_t * p, Gia_Man_t * pGia )
{
    Vec_Int_t * vPackingNew;
    Gia_Obj_t * pObj, * pObjNew;
    int i, k, Entry, nEntries, nEntries2;
    if ( pGia->vPacking == NULL )
        return;
    nEntries = Vec_IntEntry( pGia->vPacking, 0 );
    nEntries2 = 0;
    // create new packing info
    vPackingNew = Vec_IntAlloc( Vec_IntSize(pGia->vPacking) );
    Vec_IntPush( vPackingNew, nEntries );
    Vec_IntForEachEntryStart( pGia->vPacking, Entry, i, 1 )
    {
        assert( Entry > 0 && Entry < 4 );
        Vec_IntPush( vPackingNew, Entry );
        i++;
        for ( k = 0; k < Entry; k++, i++ )
        {
            pObj = Gia_ManObj(pGia, Vec_IntEntry(pGia->vPacking, i));
            pObjNew = Gia_ManObj(p, Abc_Lit2Var(Gia_ObjValue(pObj)));
            assert( Gia_ObjIsLut(pGia, Gia_ObjId(pGia, pObj)) );
            assert( Gia_ObjIsLut(p, Gia_ObjId(p, pObjNew)) );
            Vec_IntPush( vPackingNew, Gia_ObjId(p, pObjNew) );
//            printf( "%d -> %d  ", Vec_IntEntry(pGia->vPacking, i), Gia_ObjId(p, pObjNew) );
        }
        i--;
        nEntries2++;
    }
    assert( nEntries == nEntries2 );
    // attach packing info
    assert( p->vPacking == NULL );
    p->vPacking = vPackingNew;
}